

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdc-reader.cc
# Opt level: O2

bool __thiscall
tinyusdz::usdc::USDCReader::Impl::ReconstructPrim<tinyusdz::Shader>
          (Impl *this,Specifier *spec,Node *node,PathIndexToSpecIndexMap *psmap,Shader *prim)

{
  bool bVar1;
  ostream *poVar2;
  PropertyMap properties;
  ReferenceList refs;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
  local_1e8;
  string local_1b8;
  ReferenceList local_198 [11];
  
  local_1e8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_1e8._M_impl.super__Rb_tree_header._M_header;
  local_1e8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_1e8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_1e8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_1e8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_1e8._M_impl.super__Rb_tree_header._M_header._M_left;
  bVar1 = BuildPropertyMap(this,&node->_children,psmap,(PropertyMap *)&local_1e8);
  if (bVar1) {
    local_198[0].first = ResetToExplicit;
    local_198[0].second.
    super__Vector_base<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_198[0].second.
    super__Vector_base<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_198[0].second.
    super__Vector_base<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_1b8._M_dataplus._M_p._0_1_ = (this->_config).strict_allowedToken_check;
    bVar1 = tinyusdz::prim::ReconstructPrim<tinyusdz::Shader>
                      (spec,(PropertyMap *)&local_1e8,local_198,prim,&this->_warn,&this->_err,
                       (PrimReconstructOptions *)&local_1b8);
    ::std::vector<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_>::~vector
              (&local_198[0].second);
  }
  else {
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
    poVar2 = ::std::operator<<((ostream *)local_198,"[error]");
    poVar2 = ::std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                              );
    poVar2 = ::std::operator<<(poVar2,"[USDC]");
    poVar2 = ::std::operator<<(poVar2,":");
    poVar2 = ::std::operator<<(poVar2,"ReconstructPrim");
    poVar2 = ::std::operator<<(poVar2,"():");
    poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x5dc);
    ::std::operator<<(poVar2," ");
    poVar2 = ::std::operator<<((ostream *)local_198,"Failed to build PropertyMap.");
    ::std::operator<<(poVar2,"\n");
    ::std::__cxx11::stringbuf::str();
    PushError(this,&local_1b8);
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
    bVar1 = false;
  }
  ::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
  ::~_Rb_tree(&local_1e8);
  return bVar1;
}

Assistant:

bool USDCReader::Impl::ReconstructPrim(const Specifier &spec, const crate::CrateReader::Node &node,
                                       const PathIndexToSpecIndexMap &psmap,
                                       T *prim) {
  // Prim's properties are stored in its children nodes.
  prim::PropertyMap properties;
  if (!BuildPropertyMap(node.GetChildren(), psmap, &properties)) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, "Failed to build PropertyMap.");
  }

  prim::ReferenceList refs;  // dummy

  prim::PrimReconstructOptions reconstruct_options;
  reconstruct_options.strict_allowedToken_check = _config.strict_allowedToken_check;

  if (!prim::ReconstructPrim<T>(spec, properties, refs, prim, &_warn, &_err, reconstruct_options)) {
    return false;
  }

  return true;
}